

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

MaybeResult<wasm::IRBuilder::HoistedVal> * __thiscall
wasm::IRBuilder::hoistLastValue
          (MaybeResult<wasm::IRBuilder::HoistedVal> *__return_storage_ptr__,IRBuilder *this)

{
  bool bVar1;
  ScopeCtx *pSVar2;
  size_type sVar3;
  reference ppEVar4;
  ulong uVar5;
  Expression *expr_00;
  uint *puVar6;
  LocalSet *pLVar7;
  HoistedVal local_118;
  uintptr_t local_108;
  LocalGet *local_100;
  LocalGet *get;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<unsigned_int> _val;
  undefined1 local_88 [8];
  Result<unsigned_int> scratchIdx;
  BasicType local_50 [2];
  Type local_48;
  Type type;
  Expression **expr;
  LocalGet *local_30;
  BasicType local_28;
  uint local_24;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvStack_20;
  int index;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *stack;
  IRBuilder *this_local;
  
  stack = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  pSVar2 = getScope(this);
  pvStack_20 = &pSVar2->exprStack;
  sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(pvStack_20);
  local_24 = (uint)sVar3;
  do {
    local_24 = local_24 - 1;
    if ((int)local_24 < 0) break;
    ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                        (pvStack_20,(long)(int)local_24);
    local_28 = none;
    bVar1 = wasm::Type::operator!=(&(*ppEVar4)->type,&local_28);
  } while (!bVar1);
  if ((int)local_24 < 0) {
    MaybeResult<wasm::IRBuilder::HoistedVal>::MaybeResult(__return_storage_ptr__);
  }
  else {
    uVar5 = (ulong)local_24;
    sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(pvStack_20);
    if (uVar5 == sVar3 - 1) {
      expr._0_4_ = local_24;
      local_30 = (LocalGet *)0x0;
      MaybeResult<wasm::IRBuilder::HoistedVal>::MaybeResult<wasm::IRBuilder::HoistedVal>
                (__return_storage_ptr__,(HoistedVal *)&expr);
    }
    else {
      type.id = (uintptr_t)
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (pvStack_20,(long)(int)local_24);
      local_48.id = ((*(value_type *)type.id)->type).id;
      local_50[1] = 1;
      bVar1 = wasm::Type::operator==(&local_48,local_50 + 1);
      if (bVar1) {
        ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                            (pvStack_20);
        local_50[0] = unreachable;
        bVar1 = wasm::Type::operator!=(&(*ppEVar4)->type,local_50);
        if (bVar1) {
          expr_00 = (Expression *)Builder::makeUnreachable(&this->builder);
          push(this,expr_00);
        }
        scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_ = local_24;
        MaybeResult<wasm::IRBuilder::HoistedVal>::MaybeResult<wasm::IRBuilder::HoistedVal>
                  (__return_storage_ptr__,
                   (HoistedVal *)
                   ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      }
      else {
        _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = local_48.id;
        addScratchLocal((Result<unsigned_int> *)local_88,this,local_48);
        Result<unsigned_int>::Result
                  ((Result<unsigned_int> *)local_b8,(Result<unsigned_int> *)local_88);
        local_d0 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_b8);
        bVar1 = local_d0 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_f0,local_d0);
          MaybeResult<wasm::IRBuilder::HoistedVal>::MaybeResult(__return_storage_ptr__,&local_f0);
          wasm::Err::~Err(&local_f0);
        }
        get._4_4_ = (uint)bVar1;
        Result<unsigned_int>::~Result((Result<unsigned_int> *)local_b8);
        if (get._4_4_ == 0) {
          puVar6 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_88);
          pLVar7 = Builder::makeLocalSet(&this->builder,*puVar6,*(Expression **)type.id);
          *(LocalSet **)type.id = pLVar7;
          puVar6 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_88);
          local_108 = local_48.id;
          local_100 = Builder::makeLocalGet(&this->builder,*puVar6,local_48);
          push(this,(Expression *)local_100);
          local_118.valIndex = local_24;
          local_118.get = local_100;
          MaybeResult<wasm::IRBuilder::HoistedVal>::MaybeResult<wasm::IRBuilder::HoistedVal>
                    (__return_storage_ptr__,&local_118);
          get._4_4_ = 1;
        }
        Result<unsigned_int>::~Result((Result<unsigned_int> *)local_88);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<IRBuilder::HoistedVal> IRBuilder::hoistLastValue() {
  auto& stack = getScope().exprStack;
  int index = stack.size() - 1;
  for (; index >= 0; --index) {
    if (stack[index]->type != Type::none) {
      break;
    }
  }
  if (index < 0) {
    // There is no value-producing or unreachable expression.
    return {};
  }
  if (unsigned(index) == stack.size() - 1) {
    // Value-producing expression already on top of the stack.
    return HoistedVal{Index(index), nullptr};
  }
  auto*& expr = stack[index];
  auto type = expr->type;
  if (type == Type::unreachable) {
    // Make sure the top of the stack also has an unreachable expression.
    if (stack.back()->type != Type::unreachable) {
      push(builder.makeUnreachable());
    }
    return HoistedVal{Index(index), nullptr};
  }
  // Hoist with a scratch local.
  auto scratchIdx = addScratchLocal(type);
  CHECK_ERR(scratchIdx);
  expr = builder.makeLocalSet(*scratchIdx, expr);
  auto* get = builder.makeLocalGet(*scratchIdx, type);
  push(get);
  return HoistedVal{Index(index), get};
}